

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Gluco::selectionSort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  uint uVar1;
  bool bVar2;
  uint local_28;
  uint tmp;
  int best_i;
  int j;
  int i;
  int size_local;
  uint *array_local;
  reduceDB_lt lt_local;
  
  array_local = (uint *)lt.ca;
  for (best_i = 0; best_i < size + -1; best_i = best_i + 1) {
    local_28 = best_i;
    tmp = best_i;
    while (tmp = tmp + 1, (int)tmp < size) {
      bVar2 = reduceDB_lt::operator()
                        ((reduceDB_lt *)&array_local,array[(int)tmp],array[(int)local_28]);
      if (bVar2) {
        local_28 = tmp;
      }
    }
    uVar1 = array[best_i];
    array[best_i] = array[(int)local_28];
    array[(int)local_28] = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T* array, int size, LessThan lt)
{
    int     i, j, best_i;
    T       tmp;

    for (i = 0; i < size-1; i++){
        best_i = i;
        for (j = i+1; j < size; j++){
            if (lt(array[j], array[best_i]))
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}